

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

void Lib::List<Inferences::ALASCA::Demodulation::Rhs>::destroy
               (List<Inferences::ALASCA::Demodulation::Rhs> *l)

{
  bool bVar1;
  List<Inferences::ALASCA::Demodulation::Rhs> *l_00;
  List<Inferences::ALASCA::Demodulation::Rhs> *in_RDI;
  List<Inferences::ALASCA::Demodulation::Rhs> *next;
  List<Inferences::ALASCA::Demodulation::Rhs> *current;
  size_t in_stack_ffffffffffffffd8;
  
  bVar1 = isEmpty(in_RDI);
  while (!bVar1) {
    l_00 = tail(in_RDI);
    if (in_RDI != (List<Inferences::ALASCA::Demodulation::Rhs> *)0x0) {
      operator_delete(in_RDI,in_stack_ffffffffffffffd8);
    }
    bVar1 = isEmpty(l_00);
    in_RDI = l_00;
  }
  return;
}

Assistant:

static void destroy (List *l)
  {
    if (isEmpty(l)) return;
    List* current = l;

    for (;;) {
      List* next = current->tail();
      delete current;
      if (isEmpty(next)) return;
      current = next;
    }
  }